

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassBuilder.cpp
# Opt level: O3

void __thiscall Lodtalk::ClassBuilder::finish(ClassBuilder *this)

{
  undefined8 *puVar1;
  ulong uVar2;
  Array *pAVar3;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar4;
  pointer pbVar5;
  long lVar6;
  pointer pbVar7;
  long lVar8;
  ulong uVar9;
  
  pAVar3 = Array::basicNativeNew
                     (this->context,
                      (long)(this->instanceVariableNames).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->instanceVariableNames).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
  puVar1 = (undefined8 *)(this->clazz).reference.oop.field_0.uintValue;
  if (puVar1 != &NilObject) {
    puVar1[6] = pAVar3;
    pbVar7 = (this->instanceVariableNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (this->instanceVariableNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar5 == pbVar7) {
      lVar8 = 0;
    }
    else {
      lVar8 = 0;
      uVar9 = 0;
      do {
        aVar4 = (anon_union_8_4_0eb573b0_for_Oop_0)
                ByteSymbol::fromNative
                          (this->context,(string *)((long)&(pbVar7->_M_dataplus)._M_p + lVar8));
        puVar1 = (undefined8 *)(this->clazz).reference.oop.field_0.uintValue;
        if (puVar1 == &NilObject) goto LAB_0013370c;
        uVar2 = puVar1[6];
        lVar6 = uVar2 + 8;
        if ((uVar2 & 7) != 0) {
          lVar6 = 0;
        }
        *(anon_union_8_4_0eb573b0_for_Oop_0 *)(lVar6 + uVar9 * 8) = aVar4;
        uVar9 = uVar9 + 1;
        pbVar7 = (this->instanceVariableNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 = (this->instanceVariableNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        lVar8 = lVar8 + 0x20;
      } while (uVar9 < (ulong)((long)pbVar5 - (long)pbVar7 >> 5));
      lVar8 = (long)pbVar5 - (long)pbVar7 >> 4;
    }
    if (pbVar7 == pbVar5) {
LAB_001336f3:
      createClassMethodDict(this);
      createMetaclassMethodDict(this);
      return;
    }
    puVar1 = (undefined8 *)(this->clazz).reference.oop.field_0.uintValue;
    if (puVar1 != &NilObject) {
      if ((puVar1[4] & 1) != 0) {
        puVar1[4] = puVar1[4] + lVar8 | 1;
        puVar1 = (undefined8 *)(this->clazz).reference.oop.field_0.uintValue;
        if (puVar1 == &NilObject) goto LAB_0013370c;
        if ((puVar1[3] & 1) != 0) {
          if ((ulong)puVar1[3] < 2) {
            puVar1[3] = 3;
          }
          goto LAB_001336f3;
        }
      }
      __assert_fail("isSmallInteger()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                    ,0x200,"SmallIntegerValue Lodtalk::Oop::decodeSmallInteger() const");
    }
  }
LAB_0013370c:
  __assert_fail("!isNil()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                ,0x3bf,"T *Lodtalk::Ref<Lodtalk::Class>::operator->() const [T = Lodtalk::Class]");
}

Assistant:

void ClassBuilder::finish()
{
    clazz->instanceVariables = Oop::fromPointer(Array::basicNativeNew(context, instanceVariableNames.size()));
    for(size_t i = 0; i < instanceVariableNames.size(); ++i)
    {
        auto varNameSymbol = ByteSymbol::fromNative(context, instanceVariableNames[i]);
        auto array = reinterpret_cast<Oop*> (clazz->instanceVariables.getFirstFieldPointer());
        array[i] = varNameSymbol;
    }

    // Set the fixed variable count.
    if(!instanceVariableNames.empty())
    {
        clazz->fixedVariableCount = Oop::encodeSmallInteger(clazz->fixedVariableCount.decodeSmallInteger() + instanceVariableNames.size());
        if(clazz->format.decodeSmallInteger() == OF_EMPTY)
            clazz->format = Oop::encodeSmallInteger(OF_FIXED_SIZE);
    }

    createClassMethodDict();
    createMetaclassMethodDict();
}